

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS
ref_geom_support_between(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_BOOL *needs_support)

{
  uint uVar1;
  REF_INT local_68;
  REF_INT local_64;
  REF_INT local_60;
  int local_5c;
  REF_INT local_58;
  int local_54;
  int local_4c;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL has_id;
  REF_INT id;
  REF_INT type;
  REF_INT geom1;
  REF_INT geom0;
  REF_INT item1;
  REF_INT item0;
  REF_GEOM ref_geom;
  REF_BOOL *needs_support_local;
  REF_INT node1_local;
  REF_INT node0_local;
  REF_GRID ref_grid_local;
  
  _item1 = ref_grid->geom;
  *needs_support = 0;
  if ((node0 < 0) || (_item1->ref_adj->nnode <= node0)) {
    local_54 = -1;
  }
  else {
    local_54 = _item1->ref_adj->first[node0];
  }
  geom0 = local_54;
  if (local_54 == -1) {
    local_58 = -1;
  }
  else {
    local_58 = _item1->ref_adj->item[local_54].ref;
  }
  type = local_58;
  ref_geom = (REF_GEOM)needs_support;
  needs_support_local._0_4_ = node1;
  needs_support_local._4_4_ = node0;
  _node1_local = ref_grid;
  do {
    if (geom0 == -1) {
      return 0;
    }
    if (((REF_INT)needs_support_local < 0) ||
       (_item1->ref_adj->nnode <= (REF_INT)needs_support_local)) {
      local_5c = -1;
    }
    else {
      local_5c = _item1->ref_adj->first[(REF_INT)needs_support_local];
    }
    geom1 = local_5c;
    if (local_5c == -1) {
      local_60 = -1;
    }
    else {
      local_60 = _item1->ref_adj->item[local_5c].ref;
    }
    id = local_60;
    while (geom1 != -1) {
      has_id = 2;
      if (((_item1->descr[type * 6] == 2) && (_item1->descr[id * 6] == 2)) &&
         (_item1->descr[type * 6 + 1] == _item1->descr[id * 6 + 1])) {
        ref_private_macro_code_rss = _item1->descr[type * 6 + 1];
        uVar1 = ref_cell_side_has_id
                          (_node1_local->cell[3],needs_support_local._4_4_,
                           (REF_INT)needs_support_local,ref_private_macro_code_rss,&local_4c);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x5b2,"ref_geom_support_between",(ulong)uVar1,"has edge id");
          return uVar1;
        }
        if (local_4c != 0) {
          ref_geom->n = 1;
          return 0;
        }
      }
      geom1 = _item1->ref_adj->item[geom1].next;
      if (geom1 == -1) {
        local_64 = -1;
      }
      else {
        local_64 = _item1->ref_adj->item[geom1].ref;
      }
      id = local_64;
    }
    geom0 = _item1->ref_adj->item[geom0].next;
    if (geom0 == -1) {
      local_68 = -1;
    }
    else {
      local_68 = _item1->ref_adj->item[geom0].ref;
    }
    type = local_68;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_geom_support_between(REF_GRID ref_grid, REF_INT node0,
                                            REF_INT node1,
                                            REF_BOOL *needs_support) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_INT item0, item1;
  REF_INT geom0, geom1;
  REF_INT type, id;
  REF_BOOL has_id;

  *needs_support = REF_FALSE;
  /* assume face check is sufficient */
  each_ref_adj_node_item_with_ref(ref_geom_adj(ref_geom), node0, item0, geom0)
      each_ref_adj_node_item_with_ref(ref_geom_adj(ref_geom), node1, item1,
                                      geom1) {
    type = REF_GEOM_FACE;
    if (ref_geom_type(ref_geom, geom0) == type &&
        ref_geom_type(ref_geom, geom1) == type &&
        ref_geom_id(ref_geom, geom0) == ref_geom_id(ref_geom, geom1)) {
      id = ref_geom_id(ref_geom, geom0);
      RSS(ref_cell_side_has_id(ref_grid_tri(ref_grid), node0, node1, id,
                               &has_id),
          "has edge id");
      if (has_id) {
        *needs_support = REF_TRUE;
        return REF_SUCCESS;
      }
    }
  }

  return REF_SUCCESS;
}